

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O0

void Cmd_gc(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Usage: gc stop|now|full|pause [size]|stepmul [size]\n");
  }
  else {
    pcVar2 = FCommandLine::operator[](argv,1);
    iVar1 = strcasecmp(pcVar2,"stop");
    if (iVar1 == 0) {
      GC::Threshold = 0xfffffffffffffffd;
    }
    else {
      pcVar2 = FCommandLine::operator[](argv,1);
      iVar1 = strcasecmp(pcVar2,"now");
      if (iVar1 == 0) {
        GC::Threshold = GC::AllocBytes;
      }
      else {
        pcVar2 = FCommandLine::operator[](argv,1);
        iVar1 = strcasecmp(pcVar2,"full");
        if (iVar1 == 0) {
          GC::FullGC();
        }
        else {
          pcVar2 = FCommandLine::operator[](argv,1);
          iVar1 = strcasecmp(pcVar2,"pause");
          if (iVar1 == 0) {
            iVar1 = FCommandLine::argc(argv);
            if (iVar1 == 2) {
              Printf("Current GC pause is %d\n",(ulong)GC::Pause);
            }
            else {
              pcVar2 = FCommandLine::operator[](argv,2);
              iVar1 = atoi(pcVar2);
              GC::Pause = MAX<int>(1,iVar1);
            }
          }
          else {
            pcVar2 = FCommandLine::operator[](argv,1);
            iVar1 = strcasecmp(pcVar2,"stepmul");
            if (iVar1 == 0) {
              iVar1 = FCommandLine::argc(argv);
              if (iVar1 == 2) {
                Printf("Current GC stepmul is %d\n",(ulong)GC::StepMul);
              }
              else {
                pcVar2 = FCommandLine::operator[](argv,2);
                iVar1 = atoi(pcVar2);
                GC::StepMul = MAX<int>(100,iVar1);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

CCMD(gc)
{
	if (argv.argc() == 1)
	{
		Printf ("Usage: gc stop|now|full|pause [size]|stepmul [size]\n");
		return;
	}
	if (stricmp(argv[1], "stop") == 0)
	{
		GC::Threshold = ~(size_t)0 - 2;
	}
	else if (stricmp(argv[1], "now") == 0)
	{
		GC::Threshold = GC::AllocBytes;
	}
	else if (stricmp(argv[1], "full") == 0)
	{
		GC::FullGC();
	}
	else if (stricmp(argv[1], "pause") == 0)
	{
		if (argv.argc() == 2)
		{
			Printf ("Current GC pause is %d\n", GC::Pause);
		}
		else
		{
			GC::Pause = MAX(1,atoi(argv[2]));
		}
	}
	else if (stricmp(argv[1], "stepmul") == 0)
	{
		if (argv.argc() == 2)
		{
			Printf ("Current GC stepmul is %d\n", GC::StepMul);
		}
		else
		{
			GC::StepMul = MAX(100, atoi(argv[2]));
		}
	}
}